

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterWriteVFormatElementNS
              (xmlTextWriterPtr writer,xmlChar *prefix,xmlChar *name,xmlChar *namespaceURI,
              char *format,__va_list_tag *argptr)

{
  int iVar1;
  xmlChar *content;
  
  if ((writer != (xmlTextWriterPtr)0x0) &&
     (content = xmlTextWriterVSprintf(format,argptr), content != (xmlChar *)0x0)) {
    iVar1 = xmlTextWriterWriteElementNS(writer,prefix,name,namespaceURI,content);
    (*xmlFree)(content);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlTextWriterWriteVFormatElementNS(xmlTextWriterPtr writer,
                                   const xmlChar * prefix,
                                   const xmlChar * name,
                                   const xmlChar * namespaceURI,
                                   const char *format, va_list argptr)
{
    int rc;
    xmlChar *buf;

    if (writer == NULL)
        return -1;

    buf = xmlTextWriterVSprintf(format, argptr);
    if (buf == NULL)
        return -1;

    rc = xmlTextWriterWriteElementNS(writer, prefix, name, namespaceURI,
                                     buf);

    xmlFree(buf);
    return rc;
}